

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

bool el::Configurations::Parser::parseFromFile
               (string *configurationFile,Configurations *sender,Configurations *base)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  Level currLevel;
  string line;
  string currLevelStr;
  string currConfigStr;
  string local_3e0 [32];
  stringstream internalInfoStream;
  ostream local_3b0 [376];
  ifstream fileStream_;
  int aiStack_218 [122];
  
  setFromBase(sender,base);
  std::ifstream::ifstream(&fileStream_,(configurationFile->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)&internalInfoStream);
    poVar3 = std::operator<<(local_3b0,"Unable to open configuration file [");
    poVar3 = std::operator<<(poVar3,(string *)configurationFile);
    std::operator<<(poVar3,"] for parsing.");
    poVar3 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x14e);
    poVar3 = std::operator<<(poVar3,") [fileStream_.is_open()");
    poVar3 = std::operator<<(poVar3,"] WITH MESSAGE \"");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,(string *)&line);
    poVar3 = std::operator<<(poVar3,"\"");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::stringstream::~stringstream((stringstream *)&internalInfoStream);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  bVar2 = false;
  line.field_2._M_local_buf[0] = '\0';
  currLevel = Unknown;
  currConfigStr._M_dataplus._M_p = (pointer)&currConfigStr.field_2;
  currConfigStr._M_string_length = 0;
  currLevelStr._M_dataplus._M_p = (pointer)&currLevelStr.field_2;
  currLevelStr._M_string_length = 0;
  currConfigStr.field_2._M_local_buf[0] = '\0';
  currLevelStr.field_2._M_local_buf[0] = '\0';
  while (*(int *)((long)aiStack_218 + *(long *)(_fileStream_ + -0x18)) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&fileStream_,(string *)&line);
    bVar2 = parseLine(&line,&currConfigStr,&currLevelStr,&currLevel,sender);
    if (!bVar2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&internalInfoStream);
      poVar3 = std::operator<<(local_3b0,"Unable to parse configuration line: ");
      std::operator<<(poVar3,(string *)&line);
      poVar3 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ")
      ;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x157);
      poVar3 = std::operator<<(poVar3,") [parsedSuccessfully");
      poVar3 = std::operator<<(poVar3,"] WITH MESSAGE \"");
      std::__cxx11::stringbuf::str();
      poVar3 = std::operator<<(poVar3,local_3e0);
      poVar3 = std::operator<<(poVar3,"\"");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string(local_3e0);
      std::__cxx11::stringstream::~stringstream((stringstream *)&internalInfoStream);
    }
  }
  std::__cxx11::string::~string((string *)&currLevelStr);
  std::__cxx11::string::~string((string *)&currConfigStr);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&fileStream_);
  return bVar2;
}

Assistant:

bool Configurations::Parser::parseFromFile(const std::string& configurationFile, Configurations* sender,
    Configurations* base) {
  sender->setFromBase(base);
  std::ifstream fileStream_(configurationFile.c_str(), std::ifstream::in);
  ELPP_ASSERT(fileStream_.is_open(), "Unable to open configuration file [" << configurationFile << "] for parsing.");
  bool parsedSuccessfully = false;
  std::string line = std::string();
  Level currLevel = Level::Unknown;
  std::string currConfigStr = std::string();
  std::string currLevelStr = std::string();
  while (fileStream_.good()) {
    std::getline(fileStream_, line);
    parsedSuccessfully = parseLine(&line, &currConfigStr, &currLevelStr, &currLevel, sender);
    ELPP_ASSERT(parsedSuccessfully, "Unable to parse configuration line: " << line);
  }
  return parsedSuccessfully;
}